

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O3

int bb_depends_on(basic_block *target,basic_block *src)

{
  int iVar1;
  uint uVar2;
  pseudo_t pseudo;
  undefined1 local_38 [8];
  ptr_list_iter pseudoiter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_38,(ptr_list *)src);
  pseudo = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_38);
  if (pseudo == (pseudo_t)0x0) {
    uVar2 = 0;
  }
  else {
    do {
      iVar1 = dmrC_pseudo_in_list(target->needs,pseudo);
      if (iVar1 != 0) break;
      pseudo = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_38);
    } while (pseudo != (pseudo_t)0x0);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

static int bb_depends_on(struct basic_block *target, struct basic_block *src)
{
	pseudo_t pseudo;

	FOR_EACH_PTR(src->defines, pseudo) {
		if (dmrC_pseudo_in_list(target->needs, pseudo))
			return 1;
	} END_FOR_EACH_PTR(pseudo);
	return 0;
}